

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AmpIO.cpp
# Opt level: O3

void __thiscall AmpIO::~AmpIO(AmpIO *this)

{
  BasePort *pBVar1;
  uint uVar2;
  ostream *poVar3;
  PortType portType;
  string local_30;
  
  (this->super_FpgaIO).super_BoardIO._vptr_BoardIO = (_func_int **)&PTR_InitBoard_00127490;
  if ((this->super_FpgaIO).super_BoardIO.port != (BasePort *)0x0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Warning: AmpIO being destroyed while still in use by ",0x35);
    uVar2 = (*((this->super_FpgaIO).super_BoardIO.port)->_vptr_BasePort[0xf])();
    BasePort::PortTypeString_abi_cxx11_(&local_30,(BasePort *)(ulong)uVar2,portType);
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cerr,local_30._M_dataplus._M_p,local_30._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3," Port",5);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
    std::ostream::put((char)poVar3);
    std::ostream::flush();
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_30._M_dataplus._M_p != &local_30.field_2) {
      operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
    }
    pBVar1 = (this->super_FpgaIO).super_BoardIO.port;
    (*pBVar1->_vptr_BasePort[0xe])(pBVar1,(ulong)(this->super_FpgaIO).super_BoardIO.BoardId);
  }
  FpgaIO::~FpgaIO(&this->super_FpgaIO);
  return;
}

Assistant:

AmpIO::~AmpIO()
{
    if (port) {
        std::cerr << "Warning: AmpIO being destroyed while still in use by "
                  << BasePort::PortTypeString(port->GetPortType()) <<" Port" << std::endl;
        port->RemoveBoard(this);
    }
}